

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassembler.cpp
# Opt level: O0

void __thiscall LLVMBC::StreamState::append(StreamState *this,GlobalVariable *var,bool decl)

{
  bool bVar1;
  uint uVar2;
  Type *pTVar3;
  PointerType *this_00;
  uint64_t local_40;
  Constant *local_38;
  char *local_30;
  uint64_t local_28;
  undefined1 local_19;
  GlobalVariable *pGStack_18;
  bool decl_local;
  GlobalVariable *var_local;
  StreamState *this_local;
  
  local_19 = decl;
  pGStack_18 = var;
  var_local = (GlobalVariable *)this;
  if (decl) {
    local_28 = Value::get_tween_id((Value *)var);
    append<char_const(&)[2],unsigned_long,char_const(&)[4]>
              (this,(char (*) [2])0x2a9093,&local_28,(char (*) [4])" = ");
    pTVar3 = Value::getType((Value *)pGStack_18);
    this_00 = cast<LLVMBC::PointerType>(pTVar3);
    uVar2 = Type::getAddressSpace(&this_00->super_Type);
    if (uVar2 == 0) {
      bVar1 = GlobalVariable::isConstant(pGStack_18);
      local_30 = "global";
      if (bVar1) {
        local_30 = "constant";
      }
      append<char_const*,char_const(&)[2]>(this,&local_30,(char (*) [2])0x2a8f72);
    }
    else {
      append(this,"groupshared ");
    }
    pTVar3 = Value::getType((Value *)pGStack_18);
    pTVar3 = Type::getPointerElementType(pTVar3);
    append(this,pTVar3);
    bVar1 = GlobalVariable::hasInitializer(pGStack_18);
    if (bVar1) {
      local_38 = GlobalVariable::getInitializer(pGStack_18);
      append<char_const(&)[2],LLVMBC::Constant*>(this,(char (*) [2])0x2a8f72,&local_38);
    }
    newline(this);
  }
  else {
    local_40 = Value::get_tween_id((Value *)var);
    append<char_const(&)[2],unsigned_long>(this,(char (*) [2])0x2a9093,&local_40);
  }
  return;
}

Assistant:

void StreamState::append(GlobalVariable *var, bool decl)
{
	if (decl)
	{
		append("@", var->get_tween_id(), " = ");

		if (cast<PointerType>(var->getType())->getAddressSpace() != 0)
			append("groupshared ");
		else
			append(var->isConstant() ? "constant" : "global", " ");
		append(var->getType()->getPointerElementType());

		if (var->hasInitializer())
			append(" ", var->getInitializer());
		newline();
	}
	else
	{
		append("@", var->get_tween_id());
	}
}